

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1enc.c
# Opt level: O2

int jpc_enc_enccblk(jpc_enc_tcmpt_t *tcmpt,jpc_enc_band_t *band,jpc_enc_cblk_t *cblk)

{
  jpc_enc_pass_t **ppjVar1;
  jpc_enc_pass_t *pjVar2;
  byte *pbVar3;
  int iVar4;
  jas_matrix_t *pjVar5;
  undefined8 uVar6;
  uint_fast16_t uVar7;
  uchar *puVar8;
  byte bVar9;
  jas_matind_t jVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  jas_stream_t *pjVar16;
  jpc_mqenc_t *pjVar17;
  jpc_enc_pass_t *pjVar18;
  jpc_enc_pass_t *pjVar19;
  jas_matrix_t *pjVar20;
  jpc_bitstream_t *bitstream;
  size_t sVar21;
  size_t sVar22;
  jas_seqent_t *pjVar23;
  ulong uVar24;
  ulong *puVar25;
  ulong *puVar26;
  byte bVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  jas_seqent_t *pjVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  long lVar38;
  jas_seqent_t *pjVar39;
  int iVar40;
  uint uVar41;
  jas_seqent_t *pjVar42;
  char *pcVar43;
  ulong *puVar44;
  uint uVar45;
  jpc_fix_t *pjVar46;
  uint uVar47;
  ulong *puVar48;
  long lVar49;
  bool bVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  jas_seqent_t *local_128;
  jas_seqent_t *local_120;
  jpc_enc_pass_t *local_118;
  jas_seqent_t *local_110;
  jas_seqent_t *local_108;
  jas_seqent_t *local_100;
  jas_seqent_t *local_f8;
  jas_seqent_t *local_f0;
  jas_seqent_t *local_e0;
  jas_seqent_t *local_d0;
  jas_seqent_t *local_c8;
  jpc_fix_t *local_b8;
  ulong *local_a8;
  ulong *local_a0;
  jas_seqent_t *local_80;
  jas_seqent_t *local_78;
  int local_70;
  
  pjVar16 = jas_stream_memopen((char *)0x0,0);
  cblk->stream = pjVar16;
  if (pjVar16 == (jas_stream_t *)0x0) {
    __assert_fail("cblk->stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                  ,0xd1,"int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                 );
  }
  pjVar17 = jpc_mqenc_create(0x13,pjVar16);
  cblk->mqenc = pjVar17;
  if (pjVar17 == (jpc_mqenc_t *)0x0) {
    __assert_fail("cblk->mqenc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                  ,0xd3,"int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                 );
  }
  jpc_mqenc_setctxs(pjVar17,0x13,jpc_mqctxs);
  uVar45 = cblk->numbps * 3 - 2;
  if (cblk->numbps < 1) {
    uVar45 = 0;
  }
  cblk->numpasses = uVar45;
  ppjVar1 = &cblk->passes;
  if (uVar45 == 0) {
    cblk->passes = (jpc_enc_pass_t *)0x0;
    pjVar18 = (jpc_enc_pass_t *)0x0;
    pjVar19 = (jpc_enc_pass_t *)0x0;
  }
  else {
    pjVar18 = (jpc_enc_pass_t *)jas_alloc2((ulong)uVar45,0x48);
    *ppjVar1 = pjVar18;
    if (pjVar18 == (jpc_enc_pass_t *)0x0) {
      __assert_fail("cblk->passes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                    ,0xd9,
                    "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
    }
    pjVar19 = pjVar18 + cblk->numpasses;
  }
  for (lVar49 = 0; pjVar2 = (jpc_enc_pass_t *)((long)&pjVar18->start + lVar49), pjVar2 != pjVar19;
      lVar49 = lVar49 + 0x48) {
    *(undefined8 *)((long)&pjVar18->start + lVar49) = 0;
    uVar45 = tcmpt->cblksty & 1;
    iVar12 = (int)(lVar49 / 0x48);
    iVar11 = JPC_ISTERMINATED(iVar12,0,cblk->numpasses,(uint)tcmpt->cblksty >> 2 & 1,uVar45);
    *(int *)((long)&pjVar18->term + lVar49) = iVar11;
    iVar12 = JPC_SEGTYPE(iVar12,0,uVar45);
    *(int *)((long)&pjVar18->type + lVar49) = iVar12;
    *(undefined4 *)((long)&pjVar18->lyrno + lVar49) = 0xffffffff;
    if (pjVar2 == pjVar19 + -1) {
      if (iVar11 != 1) {
        __assert_fail("pass->term == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                      ,0xe5,
                      "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
      }
      *(undefined4 *)((long)&pjVar18->term + lVar49) = 1;
    }
  }
  pjVar20 = jas_matrix_create(cblk->data->numrows_ + 2,cblk->data->numcols_ + 2);
  cblk->flags = pjVar20;
  if (pjVar20 == (jas_matrix_t *)0x0) {
    __assert_fail("cblk->flags",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                  ,0xec,"int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                 );
  }
  iVar11 = cblk->numbps + -1;
  pjVar18 = cblk->passes;
  bitstream = (jpc_bitstream_t *)0x0;
  local_70 = -1;
  local_118 = pjVar18;
  for (uVar45 = cblk->numpasses; 0 < (int)uVar45; uVar45 = uVar45 - 1) {
    if (local_118->type != 1) {
      if (local_118->type != 2) {
        __assert_fail("pass->type == JPC_SEG_RAW",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                      ,0xf7,
                      "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
      }
      if (bitstream == (jpc_bitstream_t *)0x0) {
        bitstream = jpc_bitstream_sopen(cblk->stream,"w");
        if (bitstream == (jpc_bitstream_t *)0x0) {
          return -1;
        }
        pjVar18 = *ppjVar1;
      }
    }
    lVar32 = (((long)local_118 - (long)pjVar18) / 0x48 + 2) % 3;
    lVar49 = jas_stream_tell(cblk->stream);
    local_118->start = (int)lVar49;
    if (iVar11 < 0) {
      __assert_fail("bitpos >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                    ,0x108,
                    "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
    }
    uVar37 = tcmpt->cblksty;
    iVar12 = local_118->term;
    iVar13 = (int)lVar32;
    bVar27 = (byte)iVar11;
    bVar9 = (byte)(uVar37 >> 3);
    if (iVar13 == 2) {
      if (local_118->type != 1) {
        __assert_fail("pass->type == JPC_SEG_MQ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                      ,0x121,
                      "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
      }
      pjVar17 = cblk->mqenc;
      pjVar20 = cblk->data;
      iVar13 = band->orient;
      pjVar5 = cblk->flags;
      local_118->nmsedec = 0;
      uVar47 = (uint)pjVar20->numrows_;
      jVar10 = pjVar20->numcols_;
      sVar21 = jas_matrix_rowstep(pjVar5);
      sVar22 = jas_matrix_rowstep(pjVar20);
      local_b8 = jpc_signmsedec;
      if (iVar11 == 0) {
        local_b8 = jpc_signmsedec0;
      }
      uVar41 = (uint)sVar21;
      iVar28 = (int)sVar22;
      local_a0 = (ulong *)(pjVar5->rows_[1] + 1);
      local_a8 = (ulong *)*pjVar20->rows_;
      lVar49 = (long)(int)uVar41;
      uVar31 = iVar13 << 8;
      uVar33 = (ulong)(0x40 << (bVar27 & 0x1f));
      while( true ) {
        uVar30 = 4;
        if (uVar47 < 4) {
          uVar30 = uVar47;
        }
        puVar25 = local_a0;
        puVar44 = local_a8;
        iVar13 = (int)jVar10;
        if ((int)uVar47 < 1) break;
        for (; 0 < iVar13; iVar13 = iVar13 + -1) {
          uVar24 = *puVar25;
          if ((((uVar47 < 4) || ((uVar24 & 0x50ff) != 0)) || ((puVar25[lVar49] & 0x50ff) != 0)) ||
             (((puVar25[lVar49 * 2] & 0x50ff) != 0 || ((puVar25[lVar49 * 3] & 0x50ff) != 0)))) {
            puVar26 = puVar25;
            puVar48 = puVar44;
            uVar29 = uVar30;
            if ((uVar24 & 0x5000) == 0) {
              pjVar17->curctx = pjVar17->ctxs + jpc_zcctxnolut[(uint)uVar24 & 0xff | uVar31];
              uVar24 = *puVar44;
              uVar36 = -uVar24;
              if (0 < (long)uVar24) {
                uVar36 = uVar24;
              }
              jpc_mqenc_putbit(pjVar17,(uint)((uVar36 & uVar33) != 0));
              if ((uVar36 & uVar33) != 0) goto switchD_0012a203_caseD_0;
              uVar24 = *puVar25;
            }
LAB_00129d44:
            *puVar26 = uVar24 & 0xffffffffffffbfff;
            if (1 < (int)uVar29) {
              uVar29 = uVar29 - 1;
              puVar26 = puVar26 + lVar49;
              puVar48 = puVar48 + iVar28;
              uVar24 = *puVar26;
              if ((uVar24 & 0x5000) == 0) {
                pjVar17->curctx = pjVar17->ctxs + jpc_zcctxnolut[(uint)uVar24 & 0xff | uVar31];
                uVar24 = *puVar48;
                uVar36 = -uVar24;
                if (0 < (long)uVar24) {
                  uVar36 = uVar24;
                }
                jpc_mqenc_putbit(pjVar17,(uint)((uVar36 & uVar33) != 0));
                if ((uVar36 & uVar33) != 0) goto switchD_0012a203_caseD_1;
                uVar24 = *puVar26;
              }
LAB_00129e7c:
              *puVar26 = uVar24 & 0xffffffffffffbfff;
              if (1 < (int)uVar29) {
                uVar29 = uVar29 - 1;
                puVar26 = puVar26 + lVar49;
                puVar48 = puVar48 + iVar28;
                uVar24 = *puVar26;
                if ((uVar24 & 0x5000) == 0) {
                  pjVar17->curctx = pjVar17->ctxs + jpc_zcctxnolut[(uint)uVar24 & 0xff | uVar31];
                  uVar24 = *puVar48;
                  uVar36 = -uVar24;
                  if (0 < (long)uVar24) {
                    uVar36 = uVar24;
                  }
                  jpc_mqenc_putbit(pjVar17,(uint)((uVar36 & uVar33) != 0));
                  if ((uVar36 & uVar33) != 0) goto switchD_0012a203_caseD_2;
                  uVar24 = *puVar26;
                }
LAB_00129fb4:
                *puVar26 = uVar24 & 0xffffffffffffbfff;
                if (1 < (int)uVar29) {
                  puVar26 = puVar26 + lVar49;
                  uVar24 = *puVar26;
                  if ((uVar24 & 0x5000) == 0) {
                    pjVar17->curctx = pjVar17->ctxs + jpc_zcctxnolut[(uint)uVar24 & 0xff | uVar31];
                    uVar24 = puVar48[iVar28];
                    uVar36 = -uVar24;
                    if (0 < (long)uVar24) {
                      uVar36 = uVar24;
                    }
                    jpc_mqenc_putbit(pjVar17,(uint)((uVar36 & uVar33) != 0));
                    if ((uVar36 & uVar33) != 0) {
                      puVar48 = puVar48 + iVar28;
                      goto switchD_0012a203_caseD_3;
                    }
                    uVar24 = *puVar26;
                  }
                  goto LAB_0012a131;
                }
              }
            }
          }
          else {
            puVar26 = puVar44;
            for (uVar24 = 0; uVar30 != (uint)uVar24; uVar24 = (ulong)((uint)uVar24 + 1)) {
              uVar36 = *puVar26;
              uVar35 = -uVar36;
              if (0 < (long)uVar36) {
                uVar35 = uVar36;
              }
              if ((uVar33 & uVar35) != 0) goto LAB_0012a14e;
              puVar26 = puVar26 + iVar28;
            }
            uVar24 = (ulong)uVar30;
LAB_0012a14e:
            pjVar17->curctx = pjVar17->ctxs;
            uVar29 = (uint)uVar24;
            if (uVar29 < 4) {
              jpc_mqenc_putbit(pjVar17,1);
              pjVar17->curctx = pjVar17->ctxs + 0x12;
              jpc_mqenc_putbit(pjVar17,(int)(uVar24 >> 1));
              jpc_mqenc_putbit(pjVar17,uVar29 & 1);
              puVar26 = puVar25 + (int)(uVar29 * uVar41);
              puVar48 = puVar44 + (int)(uVar29 * iVar28);
              uVar29 = uVar30 - uVar29;
              switch(uVar24) {
              case 0:
switchD_0012a203_caseD_0:
                uVar36 = *puVar26;
                uVar24 = *puVar48;
                uVar35 = -uVar24;
                if (0 < (long)uVar24) {
                  uVar35 = uVar24;
                }
                local_118->nmsedec =
                     local_118->nmsedec + local_b8[(uint)(uVar35 >> (bVar27 & 0x3f)) & 0x7f];
                uVar14 = (uint)uVar36 >> 4 & 0xff;
                pjVar17->curctx = pjVar17->ctxs + jpc_scctxnolut[uVar14];
                uVar24 = *puVar48;
                jpc_mqenc_putbit(pjVar17,(uint)jpc_spblut[uVar14] ^ (uint)(uVar24 >> 0x3f));
                JPC_UPDATEFLAGS4((jpc_fix_t *)puVar26,uVar41,SUB81(uVar24 >> 0x3f,0),
                                 (_Bool)(bVar9 & 1));
                uVar24 = *puVar26 | 0x1000;
                *puVar26 = uVar24;
                goto LAB_00129d44;
              case 1:
switchD_0012a203_caseD_1:
                uVar36 = *puVar26;
                uVar24 = *puVar48;
                uVar35 = -uVar24;
                if (0 < (long)uVar24) {
                  uVar35 = uVar24;
                }
                local_118->nmsedec =
                     local_118->nmsedec + local_b8[(uint)(uVar35 >> (bVar27 & 0x3f)) & 0x7f];
                uVar14 = (uint)uVar36 >> 4 & 0xff;
                pjVar17->curctx = pjVar17->ctxs + jpc_scctxnolut[uVar14];
                uVar24 = *puVar48;
                jpc_mqenc_putbit(pjVar17,(uint)jpc_spblut[uVar14] ^ (uint)(uVar24 >> 0x3f));
                JPC_UPDATEFLAGS4((jpc_fix_t *)puVar26,uVar41,SUB81(uVar24 >> 0x3f,0),false);
                uVar24 = *puVar26 | 0x1000;
                *puVar26 = uVar24;
                goto LAB_00129e7c;
              case 2:
switchD_0012a203_caseD_2:
                uVar36 = *puVar26;
                uVar24 = *puVar48;
                uVar35 = -uVar24;
                if (0 < (long)uVar24) {
                  uVar35 = uVar24;
                }
                local_118->nmsedec =
                     local_118->nmsedec + local_b8[(uint)(uVar35 >> (bVar27 & 0x3f)) & 0x7f];
                uVar14 = (uint)uVar36 >> 4 & 0xff;
                pjVar17->curctx = pjVar17->ctxs + jpc_scctxnolut[uVar14];
                uVar24 = *puVar48;
                jpc_mqenc_putbit(pjVar17,(uint)jpc_spblut[uVar14] ^ (uint)(uVar24 >> 0x3f));
                JPC_UPDATEFLAGS4((jpc_fix_t *)puVar26,uVar41,SUB81(uVar24 >> 0x3f,0),false);
                uVar24 = *puVar26 | 0x1000;
                *puVar26 = uVar24;
                goto LAB_00129fb4;
              }
switchD_0012a203_caseD_3:
              uVar36 = *puVar26;
              uVar24 = *puVar48;
              uVar35 = -uVar24;
              if (0 < (long)uVar24) {
                uVar35 = uVar24;
              }
              local_118->nmsedec =
                   local_118->nmsedec + local_b8[(uint)(uVar35 >> (bVar27 & 0x3f)) & 0x7f];
              uVar29 = (uint)uVar36 >> 4 & 0xff;
              pjVar17->curctx = pjVar17->ctxs + jpc_scctxnolut[uVar29];
              uVar24 = *puVar48;
              jpc_mqenc_putbit(pjVar17,(uint)jpc_spblut[uVar29] ^ (uint)(uVar24 >> 0x3f));
              JPC_UPDATEFLAGS4((jpc_fix_t *)puVar26,uVar41,SUB81(uVar24 >> 0x3f,0),false);
              uVar24 = *puVar26 | 0x1000;
              *puVar26 = uVar24;
LAB_0012a131:
              *puVar26 = uVar24 & 0xffffffffffffbfff;
            }
            else {
              jpc_mqenc_putbit(pjVar17,0);
            }
          }
          puVar25 = puVar25 + 1;
          puVar44 = puVar44 + 1;
        }
        uVar47 = uVar47 - 4;
        local_a0 = local_a0 + (int)(uVar41 * 4);
        local_a8 = local_a8 + iVar28 * 4;
      }
      if ((uVar37 & 0x20) != 0) {
        pjVar17->curctx = pjVar17->ctxs + 0x12;
        jpc_mqenc_putbit(pjVar17,1);
        jpc_mqenc_putbit(pjVar17,0);
        jpc_mqenc_putbit(pjVar17,1);
        jpc_mqenc_putbit(pjVar17,0);
      }
joined_r0x0012a91b:
      if (iVar12 != 0) {
        jpc_mqenc_flush(pjVar17,uVar37 >> 4 & 1);
      }
      if (pjVar17->err != 0) goto LAB_0012b59e;
    }
    else {
      if (iVar13 == 1) {
        if (local_118->type == 1) {
          pjVar17 = cblk->mqenc;
          pjVar20 = cblk->data;
          pjVar5 = cblk->flags;
          local_118->nmsedec = 0;
          uVar47 = (uint)pjVar20->numrows_;
          jVar10 = pjVar20->numcols_;
          sVar21 = jas_matrix_rowstep(pjVar5);
          sVar22 = jas_matrix_rowstep(pjVar20);
          uVar31 = 0x40 << (bVar27 & 0x1f);
          pjVar46 = jpc_refnmsedec;
          if (iVar11 == 0) {
            pjVar46 = jpc_refnmsedec0;
          }
          pjVar42 = pjVar5->rows_[1];
          pjVar34 = pjVar42 + 1;
          local_120 = *pjVar20->rows_;
          lVar49 = (long)(int)sVar21;
          iVar28 = (int)sVar21 << 2;
          lVar38 = (long)(int)sVar22;
          iVar13 = (int)sVar22 << 2;
          pjVar23 = pjVar42 + lVar49 + 1;
          local_110 = pjVar42 + lVar49 * 2 + 1;
          local_128 = pjVar42 + lVar49 * 3 + 1;
          local_f0 = local_120 + lVar38;
          local_f8 = local_120 + lVar38 * 2;
          local_e0 = local_120 + lVar38 * 3;
          for (; 0 < (int)uVar47; uVar47 = uVar47 - 4) {
            lVar49 = 0;
            for (iVar40 = (int)jVar10; 0 < iVar40; iVar40 = iVar40 + -1) {
              if ((*(uint *)((long)pjVar34 + lVar49) & 0x5000) == 0x1000) {
                uVar41 = *(uint *)((long)local_120 + lVar49);
                uVar30 = -uVar41;
                if (0 < (int)uVar41) {
                  uVar30 = uVar41;
                }
                local_118->nmsedec = local_118->nmsedec + pjVar46[uVar30 >> (bVar27 & 0x3f) & 0x7f];
                pjVar17->curctx =
                     pjVar17->ctxs +
                     jpc_magctxnolut
                     [(ulong)((uint)(*(ulong *)((long)pjVar34 + lVar49) >> 2) & 0x800) |
                      *(ulong *)((long)pjVar34 + lVar49) & 0xff];
                jpc_mqenc_putbit(pjVar17,(uint)((uVar31 & uVar30) != 0));
                pbVar3 = (byte *)((long)pjVar34 + lVar49 + 1);
                *pbVar3 = *pbVar3 | 0x20;
              }
              if (uVar47 != 1) {
                if ((*(uint *)((long)pjVar23 + lVar49) & 0x5000) == 0x1000) {
                  uVar41 = *(uint *)((long)local_f0 + lVar49);
                  uVar30 = -uVar41;
                  if (0 < (int)uVar41) {
                    uVar30 = uVar41;
                  }
                  local_118->nmsedec =
                       local_118->nmsedec + pjVar46[uVar30 >> (bVar27 & 0x3f) & 0x7f];
                  pjVar17->curctx =
                       pjVar17->ctxs +
                       jpc_magctxnolut
                       [(ulong)((uint)(*(ulong *)((long)pjVar23 + lVar49) >> 2) & 0x800) |
                        *(ulong *)((long)pjVar23 + lVar49) & 0xff];
                  jpc_mqenc_putbit(pjVar17,(uint)((uVar31 & uVar30) != 0));
                  pbVar3 = (byte *)((long)pjVar23 + lVar49 + 1);
                  *pbVar3 = *pbVar3 | 0x20;
                }
                if (2 < uVar47) {
                  if ((*(uint *)((long)local_110 + lVar49) & 0x5000) == 0x1000) {
                    uVar41 = *(uint *)((long)local_f8 + lVar49);
                    uVar30 = -uVar41;
                    if (0 < (int)uVar41) {
                      uVar30 = uVar41;
                    }
                    local_118->nmsedec =
                         local_118->nmsedec + pjVar46[uVar30 >> (bVar27 & 0x3f) & 0x7f];
                    pjVar17->curctx =
                         pjVar17->ctxs +
                         jpc_magctxnolut
                         [(ulong)((uint)(*(ulong *)((long)local_110 + lVar49) >> 2) & 0x800) |
                          *(ulong *)((long)local_110 + lVar49) & 0xff];
                    jpc_mqenc_putbit(pjVar17,(uint)((uVar31 & uVar30) != 0));
                    pbVar3 = (byte *)((long)local_110 + lVar49 + 1);
                    *pbVar3 = *pbVar3 | 0x20;
                  }
                  if ((uVar47 != 3) && ((*(uint *)((long)local_128 + lVar49) & 0x5000) == 0x1000)) {
                    uVar41 = *(uint *)((long)local_e0 + lVar49);
                    uVar30 = -uVar41;
                    if (0 < (int)uVar41) {
                      uVar30 = uVar41;
                    }
                    local_118->nmsedec =
                         local_118->nmsedec + pjVar46[uVar30 >> (bVar27 & 0x3f) & 0x7f];
                    pjVar17->curctx =
                         pjVar17->ctxs +
                         jpc_magctxnolut
                         [(ulong)((uint)(*(ulong *)((long)local_128 + lVar49) >> 2) & 0x800) |
                          *(ulong *)((long)local_128 + lVar49) & 0xff];
                    jpc_mqenc_putbit(pjVar17,(uint)((uVar31 & uVar30) != 0));
                    pbVar3 = (byte *)((long)local_128 + lVar49 + 1);
                    *pbVar3 = *pbVar3 | 0x20;
                  }
                }
              }
              lVar49 = lVar49 + 8;
            }
            pjVar34 = pjVar34 + iVar28;
            pjVar23 = pjVar23 + iVar28;
            local_110 = local_110 + iVar28;
            local_128 = local_128 + iVar28;
            local_120 = local_120 + iVar13;
            local_f0 = local_f0 + iVar13;
            local_f8 = local_f8 + iVar13;
            local_e0 = local_e0 + iVar13;
          }
          goto joined_r0x0012a91b;
        }
        pjVar20 = cblk->data;
        pjVar5 = cblk->flags;
        local_118->nmsedec = 0;
        uVar37 = (uint)pjVar20->numrows_;
        jVar10 = pjVar20->numcols_;
        sVar21 = jas_matrix_rowstep(pjVar5);
        sVar22 = jas_matrix_rowstep(pjVar20);
        pjVar46 = jpc_refnmsedec;
        if (iVar11 == 0) {
          pjVar46 = jpc_refnmsedec0;
        }
        local_100 = pjVar5->rows_[1];
        pjVar34 = local_100 + 1;
        pjVar23 = *pjVar20->rows_;
        uVar33 = (ulong)(0x40 << (bVar27 & 0x1f));
        lVar49 = (long)(int)sVar21;
        iVar28 = (int)sVar21 << 2;
        lVar38 = (long)(int)sVar22;
        iVar13 = (int)sVar22 << 2;
        pjVar42 = pjVar23 + lVar38;
        local_f0 = pjVar23 + lVar38 * 2;
        local_f8 = pjVar23 + lVar38 * 3;
        pjVar39 = local_100 + lVar49 + 1;
        local_108 = local_100 + lVar49 * 2 + 1;
        local_100 = local_100 + lVar49 * 3 + 1;
        for (; 0 < (int)uVar37; uVar37 = uVar37 - 4) {
          lVar49 = 0;
          for (iVar40 = (int)jVar10; 0 < iVar40; iVar40 = iVar40 + -1) {
            if ((*(uint *)((long)pjVar34 + lVar49) & 0x5000) == 0x1000) {
              uVar24 = *(ulong *)((long)pjVar23 + lVar49);
              uVar36 = -uVar24;
              if (0 < (long)uVar24) {
                uVar36 = uVar24;
              }
              local_118->nmsedec =
                   local_118->nmsedec + pjVar46[(uint)(uVar36 >> (bVar27 & 0x3f)) & 0x7f];
              if ((bitstream->openmode_ & 2) == 0) {
                __assert_fail("((out))->openmode_ & JPC_BITSTREAM_WRITE",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                              ,0x301,
                              "int jpc_encrawrefpass(jpc_bitstream_t *, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                             );
              }
              iVar4 = bitstream->cnt_;
              iVar15 = iVar4 + -1;
              bitstream->cnt_ = iVar15;
              uVar47 = (uint)((uVar36 & uVar33) != 0);
              if (iVar4 < 1) {
                uVar7 = bitstream->buf_;
                pjVar16 = bitstream->stream_;
                uVar41 = (uint)uVar7;
                uVar31 = uVar41 & 0xff;
                uVar30 = uVar31 == 0xff ^ 7;
                bitstream->cnt_ = uVar30;
                bitstream->buf_ = (ulong)(uVar47 << (sbyte)uVar30 | uVar31 << 8);
                uVar47 = pjVar16->flags_;
                if ((uVar47 & 7) != 0) goto LAB_0012b42f;
                if ((-1 < pjVar16->rwlimit_) && (pjVar16->rwlimit_ <= pjVar16->rwcnt_))
                goto LAB_0012b424;
                *(byte *)&pjVar16->bufmode_ = (byte)pjVar16->bufmode_ | 0x20;
                iVar15 = pjVar16->cnt_;
                pjVar16->cnt_ = iVar15 + -1;
                if (iVar15 < 1) {
                  iVar15 = jas_stream_flushbuf(pjVar16,uVar41 & 0xff);
                  if (iVar15 == -1) goto LAB_0012b42f;
                }
                else {
                  pjVar16->rwcnt_ = pjVar16->rwcnt_ + 1;
                  puVar8 = pjVar16->ptr_;
                  pjVar16->ptr_ = puVar8 + 1;
                  *puVar8 = (uchar)uVar7;
                }
              }
              else {
                bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar15 & 0x1f));
              }
              pbVar3 = (byte *)((long)pjVar34 + lVar49 + 1);
              *pbVar3 = *pbVar3 | 0x20;
            }
            if (uVar37 != 1) {
              if ((*(uint *)((long)pjVar39 + lVar49) & 0x5000) == 0x1000) {
                uVar24 = *(ulong *)((long)pjVar42 + lVar49);
                uVar36 = -uVar24;
                if (0 < (long)uVar24) {
                  uVar36 = uVar24;
                }
                local_118->nmsedec =
                     local_118->nmsedec + pjVar46[(uint)(uVar36 >> (bVar27 & 0x3f)) & 0x7f];
                if ((bitstream->openmode_ & 2) == 0) {
                  __assert_fail("((out))->openmode_ & JPC_BITSTREAM_WRITE",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                ,0x308,
                                "int jpc_encrawrefpass(jpc_bitstream_t *, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                               );
                }
                iVar4 = bitstream->cnt_;
                iVar15 = iVar4 + -1;
                bitstream->cnt_ = iVar15;
                uVar47 = (uint)((uVar36 & uVar33) != 0);
                if (iVar4 < 1) {
                  uVar7 = bitstream->buf_;
                  pjVar16 = bitstream->stream_;
                  uVar41 = (uint)uVar7;
                  uVar31 = uVar41 & 0xff;
                  uVar30 = uVar31 == 0xff ^ 7;
                  bitstream->cnt_ = uVar30;
                  bitstream->buf_ = (ulong)(uVar47 << (sbyte)uVar30 | uVar31 << 8);
                  uVar47 = pjVar16->flags_;
                  if ((uVar47 & 7) != 0) goto LAB_0012b42f;
                  if ((-1 < pjVar16->rwlimit_) && (pjVar16->rwlimit_ <= pjVar16->rwcnt_))
                  goto LAB_0012b424;
                  *(byte *)&pjVar16->bufmode_ = (byte)pjVar16->bufmode_ | 0x20;
                  iVar15 = pjVar16->cnt_;
                  pjVar16->cnt_ = iVar15 + -1;
                  if (iVar15 < 1) {
                    iVar15 = jas_stream_flushbuf(pjVar16,uVar41 & 0xff);
                    if (iVar15 == -1) goto LAB_0012b42f;
                  }
                  else {
                    pjVar16->rwcnt_ = pjVar16->rwcnt_ + 1;
                    puVar8 = pjVar16->ptr_;
                    pjVar16->ptr_ = puVar8 + 1;
                    *puVar8 = (uchar)uVar7;
                  }
                }
                else {
                  bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar15 & 0x1f));
                }
                pbVar3 = (byte *)((long)pjVar39 + lVar49 + 1);
                *pbVar3 = *pbVar3 | 0x20;
              }
              if (2 < uVar37) {
                if ((*(uint *)((long)local_108 + lVar49) & 0x5000) == 0x1000) {
                  uVar24 = *(ulong *)((long)local_f0 + lVar49);
                  uVar36 = -uVar24;
                  if (0 < (long)uVar24) {
                    uVar36 = uVar24;
                  }
                  local_118->nmsedec =
                       local_118->nmsedec + pjVar46[(uint)(uVar36 >> (bVar27 & 0x3f)) & 0x7f];
                  if ((bitstream->openmode_ & 2) == 0) {
                    __assert_fail("((out))->openmode_ & JPC_BITSTREAM_WRITE",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                  ,0x30f,
                                  "int jpc_encrawrefpass(jpc_bitstream_t *, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                 );
                  }
                  iVar4 = bitstream->cnt_;
                  iVar15 = iVar4 + -1;
                  bitstream->cnt_ = iVar15;
                  uVar47 = (uint)((uVar36 & uVar33) != 0);
                  if (iVar4 < 1) {
                    uVar7 = bitstream->buf_;
                    pjVar16 = bitstream->stream_;
                    uVar41 = (uint)uVar7;
                    uVar31 = uVar41 & 0xff;
                    uVar30 = uVar31 == 0xff ^ 7;
                    bitstream->cnt_ = uVar30;
                    bitstream->buf_ = (ulong)(uVar47 << (sbyte)uVar30 | uVar31 << 8);
                    uVar47 = pjVar16->flags_;
                    if ((uVar47 & 7) != 0) goto LAB_0012b42f;
                    if ((-1 < pjVar16->rwlimit_) && (pjVar16->rwlimit_ <= pjVar16->rwcnt_))
                    goto LAB_0012b424;
                    *(byte *)&pjVar16->bufmode_ = (byte)pjVar16->bufmode_ | 0x20;
                    iVar15 = pjVar16->cnt_;
                    pjVar16->cnt_ = iVar15 + -1;
                    if (iVar15 < 1) {
                      iVar15 = jas_stream_flushbuf(pjVar16,uVar41 & 0xff);
                      if (iVar15 == -1) goto LAB_0012b42f;
                    }
                    else {
                      pjVar16->rwcnt_ = pjVar16->rwcnt_ + 1;
                      puVar8 = pjVar16->ptr_;
                      pjVar16->ptr_ = puVar8 + 1;
                      *puVar8 = (uchar)uVar7;
                    }
                  }
                  else {
                    bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar15 & 0x1f))
                    ;
                  }
                  pbVar3 = (byte *)((long)local_108 + lVar49 + 1);
                  *pbVar3 = *pbVar3 | 0x20;
                }
                if ((uVar37 != 3) && ((*(uint *)((long)local_100 + lVar49) & 0x5000) == 0x1000)) {
                  uVar24 = *(ulong *)((long)local_f8 + lVar49);
                  uVar36 = -uVar24;
                  if (0 < (long)uVar24) {
                    uVar36 = uVar24;
                  }
                  local_118->nmsedec =
                       local_118->nmsedec + pjVar46[(uint)(uVar36 >> (bVar27 & 0x3f)) & 0x7f];
                  if ((bitstream->openmode_ & 2) == 0) {
                    __assert_fail("((out))->openmode_ & JPC_BITSTREAM_WRITE",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                  ,0x316,
                                  "int jpc_encrawrefpass(jpc_bitstream_t *, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                 );
                  }
                  iVar4 = bitstream->cnt_;
                  iVar15 = iVar4 + -1;
                  bitstream->cnt_ = iVar15;
                  uVar47 = (uint)((uVar36 & uVar33) != 0);
                  if (iVar4 < 1) {
                    uVar7 = bitstream->buf_;
                    pjVar16 = bitstream->stream_;
                    uVar41 = (uint)uVar7;
                    uVar31 = uVar41 & 0xff;
                    uVar30 = uVar31 == 0xff ^ 7;
                    bitstream->cnt_ = uVar30;
                    bitstream->buf_ = (ulong)(uVar47 << (sbyte)uVar30 | uVar31 << 8);
                    uVar47 = pjVar16->flags_;
                    if ((uVar47 & 7) != 0) goto LAB_0012b42f;
                    if ((-1 < pjVar16->rwlimit_) && (pjVar16->rwlimit_ <= pjVar16->rwcnt_))
                    goto LAB_0012b424;
                    *(byte *)&pjVar16->bufmode_ = (byte)pjVar16->bufmode_ | 0x20;
                    iVar15 = pjVar16->cnt_;
                    pjVar16->cnt_ = iVar15 + -1;
                    if (iVar15 < 1) {
                      iVar15 = jas_stream_flushbuf(pjVar16,uVar41 & 0xff);
                      if (iVar15 == -1) goto LAB_0012b42f;
                    }
                    else {
                      pjVar16->rwcnt_ = pjVar16->rwcnt_ + 1;
                      puVar8 = pjVar16->ptr_;
                      pjVar16->ptr_ = puVar8 + 1;
                      *puVar8 = (uchar)uVar7;
                    }
                  }
                  else {
                    bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar15 & 0x1f))
                    ;
                  }
                  pbVar3 = (byte *)((long)local_100 + lVar49 + 1);
                  *pbVar3 = *pbVar3 | 0x20;
                }
              }
            }
            lVar49 = lVar49 + 8;
          }
          pjVar23 = pjVar23 + iVar13;
          pjVar42 = pjVar42 + iVar13;
          local_f0 = local_f0 + iVar13;
          local_f8 = local_f8 + iVar13;
          pjVar34 = pjVar34 + iVar28;
          pjVar39 = pjVar39 + iVar28;
          local_108 = local_108 + iVar28;
          local_100 = local_100 + iVar28;
        }
      }
      else {
        if (iVar13 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                        ,0x127,
                        "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                       );
        }
        if (local_118->type == 1) {
          pjVar17 = cblk->mqenc;
          pjVar20 = cblk->data;
          iVar13 = band->orient;
          pjVar5 = cblk->flags;
          local_118->nmsedec = 0;
          uVar47 = (uint)pjVar20->numrows_;
          jVar10 = pjVar20->numcols_;
          sVar21 = jas_matrix_rowstep(pjVar5);
          sVar22 = jas_matrix_rowstep(pjVar20);
          local_a0 = (ulong *)jpc_signmsedec;
          if (iVar11 == 0) {
            local_a0 = (ulong *)jpc_signmsedec0;
          }
          uVar41 = (uint)sVar21;
          iVar28 = uVar41 * 4;
          local_80 = pjVar5->rows_[1];
          local_120 = local_80 + 1;
          pjVar42 = *pjVar20->rows_;
          uVar33 = (ulong)(0x40 << (bVar27 & 0x1f));
          uVar31 = iVar13 << 8;
          lVar49 = (long)(int)uVar41;
          lVar38 = (long)(int)sVar22;
          iVar13 = (int)sVar22 << 2;
          local_d0 = local_80 + lVar49 + 1;
          local_78 = local_80 + lVar49 * 2 + 1;
          local_80 = local_80 + lVar49 * 3 + 1;
          pjVar34 = pjVar42 + lVar38;
          pjVar39 = pjVar42 + lVar38 * 2;
          pjVar23 = pjVar42 + lVar38 * 3;
          for (; 0 < (int)uVar47; uVar47 = uVar47 - 4) {
            lVar49 = 0;
            for (iVar40 = (int)jVar10; 0 < iVar40; iVar40 = iVar40 + -1) {
              puVar25 = (ulong *)((long)local_120 + lVar49);
              uVar24 = *puVar25;
              if ((uVar24 & 0x5000) == 0 && (char)uVar24 != '\0') {
                uVar36 = *(ulong *)((long)pjVar42 + lVar49);
                uVar35 = -uVar36;
                if (0 < (long)uVar36) {
                  uVar35 = uVar36;
                }
                pjVar17->curctx = pjVar17->ctxs + jpc_zcctxnolut[(uint)uVar24 & 0xff | uVar31];
                jpc_mqenc_putbit(pjVar17,(uint)((uVar35 & uVar33) != 0));
                if ((uVar35 & uVar33) == 0) {
                  uVar24 = *puVar25;
                }
                else {
                  uVar36 = *(ulong *)((long)pjVar42 + lVar49);
                  uVar35 = -uVar36;
                  if (0 < (long)uVar36) {
                    uVar35 = uVar36;
                  }
                  local_118->nmsedec =
                       local_118->nmsedec + local_a0[(uint)(uVar35 >> (bVar27 & 0x3f)) & 0x7f];
                  uVar6 = *(undefined8 *)((long)pjVar42 + lVar49);
                  uVar24 = uVar24 >> 4 & 0xff;
                  pjVar17->curctx = pjVar17->ctxs + jpc_scctxnolut[uVar24];
                  jpc_mqenc_putbit(pjVar17,(uint)jpc_spblut[uVar24] ^ (uint)((ulong)uVar6 >> 0x3f));
                  JPC_UPDATEFLAGS4((jpc_fix_t *)puVar25,uVar41,SUB81((ulong)uVar6 >> 0x3f,0),
                                   (_Bool)(bVar9 & 1));
                  uVar24 = *puVar25 | 0x1000;
                }
                *puVar25 = uVar24 | 0x4000;
              }
              if (uVar47 != 1) {
                uVar24 = *(ulong *)((long)local_d0 + lVar49);
                if ((uVar24 & 0x5000) == 0 && (char)uVar24 != '\0') {
                  puVar25 = (ulong *)((long)local_d0 + lVar49);
                  uVar36 = *(ulong *)((long)pjVar34 + lVar49);
                  uVar35 = -uVar36;
                  if (0 < (long)uVar36) {
                    uVar35 = uVar36;
                  }
                  pjVar17->curctx = pjVar17->ctxs + jpc_zcctxnolut[(uint)uVar24 & 0xff | uVar31];
                  jpc_mqenc_putbit(pjVar17,(uint)((uVar35 & uVar33) != 0));
                  if ((uVar35 & uVar33) == 0) {
                    uVar24 = *puVar25;
                  }
                  else {
                    uVar36 = *(ulong *)((long)pjVar34 + lVar49);
                    uVar35 = -uVar36;
                    if (0 < (long)uVar36) {
                      uVar35 = uVar36;
                    }
                    local_118->nmsedec =
                         local_118->nmsedec + local_a0[(uint)(uVar35 >> (bVar27 & 0x3f)) & 0x7f];
                    uVar6 = *(undefined8 *)((long)pjVar34 + lVar49);
                    uVar24 = uVar24 >> 4 & 0xff;
                    pjVar17->curctx = pjVar17->ctxs + jpc_scctxnolut[uVar24];
                    jpc_mqenc_putbit(pjVar17,(uint)jpc_spblut[uVar24] ^ (uint)((ulong)uVar6 >> 0x3f)
                                    );
                    JPC_UPDATEFLAGS4((jpc_fix_t *)puVar25,uVar41,SUB81((ulong)uVar6 >> 0x3f,0),false
                                    );
                    uVar24 = *puVar25 | 0x1000;
                  }
                  *puVar25 = uVar24 | 0x4000;
                }
                if (2 < uVar47) {
                  uVar24 = *(ulong *)((long)local_78 + lVar49);
                  if ((uVar24 & 0x5000) == 0 && (char)uVar24 != '\0') {
                    puVar25 = (ulong *)((long)local_78 + lVar49);
                    uVar36 = *(ulong *)((long)pjVar39 + lVar49);
                    uVar35 = -uVar36;
                    if (0 < (long)uVar36) {
                      uVar35 = uVar36;
                    }
                    pjVar17->curctx = pjVar17->ctxs + jpc_zcctxnolut[(uint)uVar24 & 0xff | uVar31];
                    jpc_mqenc_putbit(pjVar17,(uint)((uVar35 & uVar33) != 0));
                    if ((uVar35 & uVar33) == 0) {
                      uVar24 = *puVar25;
                    }
                    else {
                      uVar36 = *(ulong *)((long)pjVar39 + lVar49);
                      uVar35 = -uVar36;
                      if (0 < (long)uVar36) {
                        uVar35 = uVar36;
                      }
                      local_118->nmsedec =
                           local_118->nmsedec + local_a0[(uint)(uVar35 >> (bVar27 & 0x3f)) & 0x7f];
                      uVar6 = *(undefined8 *)((long)pjVar39 + lVar49);
                      uVar24 = uVar24 >> 4 & 0xff;
                      pjVar17->curctx = pjVar17->ctxs + jpc_scctxnolut[uVar24];
                      jpc_mqenc_putbit(pjVar17,(uint)jpc_spblut[uVar24] ^
                                               (uint)((ulong)uVar6 >> 0x3f));
                      JPC_UPDATEFLAGS4((jpc_fix_t *)puVar25,uVar41,SUB81((ulong)uVar6 >> 0x3f,0),
                                       false);
                      uVar24 = *puVar25 | 0x1000;
                    }
                    *puVar25 = uVar24 | 0x4000;
                  }
                  if ((uVar47 != 3) &&
                     (uVar24 = *(ulong *)((long)local_80 + lVar49),
                     (uVar24 & 0x5000) == 0 && (char)uVar24 != '\0')) {
                    puVar25 = (ulong *)((long)local_80 + lVar49);
                    uVar36 = *(ulong *)((long)pjVar23 + lVar49);
                    uVar35 = -uVar36;
                    if (0 < (long)uVar36) {
                      uVar35 = uVar36;
                    }
                    pjVar17->curctx = pjVar17->ctxs + jpc_zcctxnolut[(uint)uVar24 & 0xff | uVar31];
                    jpc_mqenc_putbit(pjVar17,(uint)((uVar35 & uVar33) != 0));
                    if ((uVar35 & uVar33) == 0) {
                      uVar24 = *puVar25;
                    }
                    else {
                      uVar36 = *(ulong *)((long)pjVar23 + lVar49);
                      uVar35 = -uVar36;
                      if (0 < (long)uVar36) {
                        uVar35 = uVar36;
                      }
                      local_118->nmsedec =
                           local_118->nmsedec + local_a0[(uint)(uVar35 >> (bVar27 & 0x3f)) & 0x7f];
                      uVar6 = *(undefined8 *)((long)pjVar23 + lVar49);
                      uVar24 = uVar24 >> 4 & 0xff;
                      pjVar17->curctx = pjVar17->ctxs + jpc_scctxnolut[uVar24];
                      jpc_mqenc_putbit(pjVar17,(uint)jpc_spblut[uVar24] ^
                                               (uint)((ulong)uVar6 >> 0x3f));
                      JPC_UPDATEFLAGS4((jpc_fix_t *)puVar25,uVar41,SUB81((ulong)uVar6 >> 0x3f,0),
                                       false);
                      uVar24 = *puVar25 | 0x1000;
                    }
                    *puVar25 = uVar24 | 0x4000;
                  }
                }
              }
              lVar49 = lVar49 + 8;
            }
            local_120 = local_120 + iVar28;
            local_d0 = local_d0 + iVar28;
            local_78 = local_78 + iVar28;
            local_80 = local_80 + iVar28;
            pjVar42 = pjVar42 + iVar13;
            pjVar34 = pjVar34 + iVar13;
            pjVar39 = pjVar39 + iVar13;
            pjVar23 = pjVar23 + iVar13;
          }
          goto joined_r0x0012a91b;
        }
        pjVar20 = cblk->data;
        pjVar5 = cblk->flags;
        local_118->nmsedec = 0;
        uVar37 = (uint)pjVar20->numrows_;
        jVar10 = pjVar20->numcols_;
        sVar21 = jas_matrix_rowstep(pjVar5);
        sVar22 = jas_matrix_rowstep(pjVar20);
        local_128 = jpc_signmsedec;
        if (iVar11 == 0) {
          local_128 = jpc_signmsedec0;
        }
        uVar31 = (uint)sVar21;
        iVar28 = uVar31 * 4;
        local_e0 = pjVar5->rows_[1];
        local_108 = local_e0 + 1;
        pjVar34 = *pjVar20->rows_;
        uVar33 = (ulong)(0x40 << (bVar27 & 0x1f));
        lVar49 = (long)(int)uVar31;
        lVar38 = (long)(int)sVar22;
        iVar13 = (int)sVar22 << 2;
        local_100 = local_e0 + lVar49 + 1;
        local_f8 = local_e0 + lVar49 * 2 + 1;
        local_e0 = local_e0 + lVar49 * 3 + 1;
        local_f0 = pjVar34 + lVar38;
        local_c8 = pjVar34 + lVar38 * 2;
        local_d0 = pjVar34 + lVar38 * 3;
        for (; 0 < (int)uVar37; uVar37 = uVar37 - 4) {
          lVar49 = 0;
          for (iVar40 = (int)jVar10; 0 < iVar40; iVar40 = iVar40 + -1) {
            puVar25 = (ulong *)((long)local_108 + lVar49);
            if ((*puVar25 & 0x5000) == 0 && (char)*puVar25 != '\0') {
              uVar24 = *(ulong *)((long)pjVar34 + lVar49);
              uVar36 = -uVar24;
              if (0 < (long)uVar24) {
                uVar36 = uVar24;
              }
              if ((bitstream->openmode_ & 2) == 0) {
                pcVar43 = "((out))->openmode_ & JPC_BITSTREAM_WRITE";
LAB_0012b619:
                __assert_fail(pcVar43,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                              ,0x23e,
                              "int jpc_encrawsigpass(jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                             );
              }
              iVar4 = bitstream->cnt_;
              iVar15 = iVar4 + -1;
              bitstream->cnt_ = iVar15;
              uVar47 = (uint)((uVar36 & uVar33) != 0);
              if (iVar4 < 1) {
                uVar7 = bitstream->buf_;
                pjVar16 = bitstream->stream_;
                uVar30 = (uint)uVar7;
                uVar41 = uVar30 & 0xff;
                uVar29 = uVar41 == 0xff ^ 7;
                bitstream->cnt_ = uVar29;
                bitstream->buf_ = (ulong)(uVar47 << (sbyte)uVar29 | uVar41 << 8);
                uVar47 = pjVar16->flags_;
                if ((uVar47 & 7) != 0) goto LAB_0012b42f;
                if ((-1 < pjVar16->rwlimit_) && (pjVar16->rwlimit_ <= pjVar16->rwcnt_))
                goto LAB_0012b424;
                *(byte *)&pjVar16->bufmode_ = (byte)pjVar16->bufmode_ | 0x20;
                iVar15 = pjVar16->cnt_;
                pjVar16->cnt_ = iVar15 + -1;
                if (iVar15 < 1) {
                  iVar15 = jas_stream_flushbuf(pjVar16,uVar30 & 0xff);
                  if (iVar15 == -1) goto LAB_0012b42f;
                }
                else {
                  pjVar16->rwcnt_ = pjVar16->rwcnt_ + 1;
                  puVar8 = pjVar16->ptr_;
                  pjVar16->ptr_ = puVar8 + 1;
                  *puVar8 = (uchar)uVar7;
                }
              }
              else {
                bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar15 & 0x1f));
              }
              if ((uVar36 & uVar33) == 0) {
                uVar24 = *puVar25;
              }
              else {
                uVar24 = *(ulong *)((long)pjVar34 + lVar49);
                uVar36 = -uVar24;
                if (0 < (long)uVar24) {
                  uVar36 = uVar24;
                }
                local_118->nmsedec =
                     local_118->nmsedec + local_128[(uint)(uVar36 >> (bVar27 & 0x3f)) & 0x7f];
                if ((bitstream->openmode_ & 2) == 0) {
                  pcVar43 = "(out)->openmode_ & JPC_BITSTREAM_WRITE";
                  goto LAB_0012b619;
                }
                uVar6 = *(undefined8 *)((long)pjVar34 + lVar49);
                iVar4 = bitstream->cnt_;
                iVar15 = iVar4 + -1;
                bitstream->cnt_ = iVar15;
                uVar47 = (uint)((ulong)uVar6 >> 0x3f);
                if (iVar4 < 1) {
                  uVar7 = bitstream->buf_;
                  pjVar16 = bitstream->stream_;
                  uVar41 = (uint)uVar7 & 0xff;
                  uVar30 = uVar41 == 0xff ^ 7;
                  bitstream->cnt_ = uVar30;
                  uVar41 = uVar47 << (sbyte)uVar30 | uVar41 << 8;
                  bitstream->buf_ = (ulong)uVar41;
                  uVar47 = pjVar16->flags_;
                  if ((uVar47 & 7) != 0) goto LAB_0012b42f;
                  if ((-1 < pjVar16->rwlimit_) && (pjVar16->rwlimit_ <= pjVar16->rwcnt_))
                  goto LAB_0012b424;
                  *(byte *)&pjVar16->bufmode_ = (byte)pjVar16->bufmode_ | 0x20;
                  iVar15 = pjVar16->cnt_;
                  pjVar16->cnt_ = iVar15 + -1;
                  if (iVar15 < 1) {
                    iVar15 = jas_stream_flushbuf(pjVar16,uVar41 >> 8);
                    if (iVar15 == -1) goto LAB_0012b42f;
                  }
                  else {
                    pjVar16->rwcnt_ = pjVar16->rwcnt_ + 1;
                    puVar8 = pjVar16->ptr_;
                    pjVar16->ptr_ = puVar8 + 1;
                    *puVar8 = (uchar)uVar7;
                  }
                }
                else {
                  bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar15 & 0x1f));
                }
                JPC_UPDATEFLAGS4((jpc_fix_t *)puVar25,uVar31,SUB81((ulong)uVar6 >> 0x3f,0),
                                 (_Bool)(bVar9 & 1));
                uVar24 = *puVar25 | 0x1000;
              }
              *puVar25 = uVar24 | 0x4000;
            }
            if (uVar37 != 1) {
              if ((*(ulong *)((long)local_100 + lVar49) & 0x5000) == 0 &&
                  (char)*(ulong *)((long)local_100 + lVar49) != '\0') {
                uVar24 = *(ulong *)((long)local_f0 + lVar49);
                uVar36 = -uVar24;
                if (0 < (long)uVar24) {
                  uVar36 = uVar24;
                }
                if ((bitstream->openmode_ & 2) == 0) {
                  pcVar43 = "((out))->openmode_ & JPC_BITSTREAM_WRITE";
LAB_0012b67f:
                  __assert_fail(pcVar43,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                ,0x246,
                                "int jpc_encrawsigpass(jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                               );
                }
                iVar4 = bitstream->cnt_;
                iVar15 = iVar4 + -1;
                bitstream->cnt_ = iVar15;
                uVar47 = (uint)((uVar36 & uVar33) != 0);
                if (iVar4 < 1) {
                  uVar7 = bitstream->buf_;
                  pjVar16 = bitstream->stream_;
                  uVar30 = (uint)uVar7;
                  uVar41 = uVar30 & 0xff;
                  uVar29 = uVar41 == 0xff ^ 7;
                  bitstream->cnt_ = uVar29;
                  bitstream->buf_ = (ulong)(uVar47 << (sbyte)uVar29 | uVar41 << 8);
                  uVar47 = pjVar16->flags_;
                  if ((uVar47 & 7) != 0) goto LAB_0012b42f;
                  if ((-1 < pjVar16->rwlimit_) && (pjVar16->rwlimit_ <= pjVar16->rwcnt_))
                  goto LAB_0012b424;
                  *(byte *)&pjVar16->bufmode_ = (byte)pjVar16->bufmode_ | 0x20;
                  iVar15 = pjVar16->cnt_;
                  pjVar16->cnt_ = iVar15 + -1;
                  if (iVar15 < 1) {
                    iVar15 = jas_stream_flushbuf(pjVar16,uVar30 & 0xff);
                    if (iVar15 == -1) goto LAB_0012b42f;
                  }
                  else {
                    pjVar16->rwcnt_ = pjVar16->rwcnt_ + 1;
                    puVar8 = pjVar16->ptr_;
                    pjVar16->ptr_ = puVar8 + 1;
                    *puVar8 = (uchar)uVar7;
                  }
                }
                else {
                  bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar15 & 0x1f));
                }
                puVar25 = (ulong *)((long)local_100 + lVar49);
                if ((uVar36 & uVar33) == 0) {
                  uVar24 = *puVar25;
                }
                else {
                  uVar24 = *(ulong *)((long)local_f0 + lVar49);
                  uVar36 = -uVar24;
                  if (0 < (long)uVar24) {
                    uVar36 = uVar24;
                  }
                  local_118->nmsedec =
                       local_118->nmsedec + local_128[(uint)(uVar36 >> (bVar27 & 0x3f)) & 0x7f];
                  if ((bitstream->openmode_ & 2) == 0) {
                    pcVar43 = "(out)->openmode_ & JPC_BITSTREAM_WRITE";
                    goto LAB_0012b67f;
                  }
                  uVar6 = *(undefined8 *)((long)local_f0 + lVar49);
                  iVar4 = bitstream->cnt_;
                  iVar15 = iVar4 + -1;
                  bitstream->cnt_ = iVar15;
                  uVar47 = (uint)((ulong)uVar6 >> 0x3f);
                  if (iVar4 < 1) {
                    uVar7 = bitstream->buf_;
                    pjVar16 = bitstream->stream_;
                    uVar41 = (uint)uVar7 & 0xff;
                    uVar30 = uVar41 == 0xff ^ 7;
                    bitstream->cnt_ = uVar30;
                    uVar41 = uVar47 << (sbyte)uVar30 | uVar41 << 8;
                    bitstream->buf_ = (ulong)uVar41;
                    uVar47 = pjVar16->flags_;
                    if ((uVar47 & 7) != 0) goto LAB_0012b42f;
                    if ((-1 < pjVar16->rwlimit_) && (pjVar16->rwlimit_ <= pjVar16->rwcnt_))
                    goto LAB_0012b424;
                    *(byte *)&pjVar16->bufmode_ = (byte)pjVar16->bufmode_ | 0x20;
                    iVar15 = pjVar16->cnt_;
                    pjVar16->cnt_ = iVar15 + -1;
                    if (iVar15 < 1) {
                      iVar15 = jas_stream_flushbuf(pjVar16,uVar41 >> 8);
                      if (iVar15 == -1) goto LAB_0012b42f;
                    }
                    else {
                      pjVar16->rwcnt_ = pjVar16->rwcnt_ + 1;
                      puVar8 = pjVar16->ptr_;
                      pjVar16->ptr_ = puVar8 + 1;
                      *puVar8 = (uchar)uVar7;
                    }
                  }
                  else {
                    bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar15 & 0x1f))
                    ;
                  }
                  JPC_UPDATEFLAGS4((jpc_fix_t *)puVar25,uVar31,SUB81((ulong)uVar6 >> 0x3f,0),false);
                  uVar24 = *puVar25 | 0x1000;
                }
                *puVar25 = uVar24 | 0x4000;
              }
              if (2 < uVar37) {
                if ((*(ulong *)((long)local_f8 + lVar49) & 0x5000) == 0 &&
                    (char)*(ulong *)((long)local_f8 + lVar49) != '\0') {
                  uVar24 = *(ulong *)((long)local_c8 + lVar49);
                  uVar36 = -uVar24;
                  if (0 < (long)uVar24) {
                    uVar36 = uVar24;
                  }
                  if ((bitstream->openmode_ & 2) == 0) {
                    pcVar43 = "((out))->openmode_ & JPC_BITSTREAM_WRITE";
LAB_0012b764:
                    __assert_fail(pcVar43,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                  ,0x24e,
                                  "int jpc_encrawsigpass(jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                 );
                  }
                  iVar4 = bitstream->cnt_;
                  iVar15 = iVar4 + -1;
                  bitstream->cnt_ = iVar15;
                  uVar47 = (uint)((uVar36 & uVar33) != 0);
                  if (iVar4 < 1) {
                    uVar7 = bitstream->buf_;
                    pjVar16 = bitstream->stream_;
                    uVar30 = (uint)uVar7;
                    uVar41 = uVar30 & 0xff;
                    uVar29 = uVar41 == 0xff ^ 7;
                    bitstream->cnt_ = uVar29;
                    bitstream->buf_ = (ulong)(uVar47 << (sbyte)uVar29 | uVar41 << 8);
                    uVar47 = pjVar16->flags_;
                    if ((uVar47 & 7) != 0) goto LAB_0012b42f;
                    if ((-1 < pjVar16->rwlimit_) && (pjVar16->rwlimit_ <= pjVar16->rwcnt_))
                    goto LAB_0012b424;
                    *(byte *)&pjVar16->bufmode_ = (byte)pjVar16->bufmode_ | 0x20;
                    iVar15 = pjVar16->cnt_;
                    pjVar16->cnt_ = iVar15 + -1;
                    if (iVar15 < 1) {
                      iVar15 = jas_stream_flushbuf(pjVar16,uVar30 & 0xff);
                      if (iVar15 == -1) goto LAB_0012b42f;
                    }
                    else {
                      pjVar16->rwcnt_ = pjVar16->rwcnt_ + 1;
                      puVar8 = pjVar16->ptr_;
                      pjVar16->ptr_ = puVar8 + 1;
                      *puVar8 = (uchar)uVar7;
                    }
                  }
                  else {
                    bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar15 & 0x1f))
                    ;
                  }
                  puVar25 = (ulong *)((long)local_f8 + lVar49);
                  if ((uVar36 & uVar33) == 0) {
                    uVar24 = *puVar25;
                  }
                  else {
                    uVar24 = *(ulong *)((long)local_c8 + lVar49);
                    uVar36 = -uVar24;
                    if (0 < (long)uVar24) {
                      uVar36 = uVar24;
                    }
                    local_118->nmsedec =
                         local_118->nmsedec + local_128[(uint)(uVar36 >> (bVar27 & 0x3f)) & 0x7f];
                    if ((bitstream->openmode_ & 2) == 0) {
                      pcVar43 = "(out)->openmode_ & JPC_BITSTREAM_WRITE";
                      goto LAB_0012b764;
                    }
                    uVar6 = *(undefined8 *)((long)local_c8 + lVar49);
                    iVar4 = bitstream->cnt_;
                    iVar15 = iVar4 + -1;
                    bitstream->cnt_ = iVar15;
                    uVar47 = (uint)((ulong)uVar6 >> 0x3f);
                    if (iVar4 < 1) {
                      uVar7 = bitstream->buf_;
                      pjVar16 = bitstream->stream_;
                      uVar41 = (uint)uVar7 & 0xff;
                      uVar30 = uVar41 == 0xff ^ 7;
                      bitstream->cnt_ = uVar30;
                      uVar41 = uVar47 << (sbyte)uVar30 | uVar41 << 8;
                      bitstream->buf_ = (ulong)uVar41;
                      uVar47 = pjVar16->flags_;
                      if ((uVar47 & 7) != 0) goto LAB_0012b42f;
                      if ((-1 < pjVar16->rwlimit_) && (pjVar16->rwlimit_ <= pjVar16->rwcnt_))
                      goto LAB_0012b424;
                      *(byte *)&pjVar16->bufmode_ = (byte)pjVar16->bufmode_ | 0x20;
                      iVar15 = pjVar16->cnt_;
                      pjVar16->cnt_ = iVar15 + -1;
                      if (iVar15 < 1) {
                        iVar15 = jas_stream_flushbuf(pjVar16,uVar41 >> 8);
                        if (iVar15 == -1) goto LAB_0012b42f;
                      }
                      else {
                        pjVar16->rwcnt_ = pjVar16->rwcnt_ + 1;
                        puVar8 = pjVar16->ptr_;
                        pjVar16->ptr_ = puVar8 + 1;
                        *puVar8 = (uchar)uVar7;
                      }
                    }
                    else {
                      bitstream->buf_ =
                           bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar15 & 0x1f));
                    }
                    JPC_UPDATEFLAGS4((jpc_fix_t *)puVar25,uVar31,SUB81((ulong)uVar6 >> 0x3f,0),false
                                    );
                    uVar24 = *puVar25 | 0x1000;
                  }
                  *puVar25 = uVar24 | 0x4000;
                }
                if ((uVar37 != 3) &&
                   ((*(ulong *)((long)local_e0 + lVar49) & 0x5000) == 0 &&
                    (char)*(ulong *)((long)local_e0 + lVar49) != '\0')) {
                  uVar24 = *(ulong *)((long)local_d0 + lVar49);
                  uVar36 = -uVar24;
                  if (0 < (long)uVar24) {
                    uVar36 = uVar24;
                  }
                  if ((bitstream->openmode_ & 2) == 0) {
                    pcVar43 = "((out))->openmode_ & JPC_BITSTREAM_WRITE";
LAB_0012b7ee:
                    __assert_fail(pcVar43,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                  ,0x256,
                                  "int jpc_encrawsigpass(jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                 );
                  }
                  iVar4 = bitstream->cnt_;
                  iVar15 = iVar4 + -1;
                  bitstream->cnt_ = iVar15;
                  uVar47 = (uint)((uVar36 & uVar33) != 0);
                  if (iVar4 < 1) {
                    uVar7 = bitstream->buf_;
                    pjVar16 = bitstream->stream_;
                    uVar30 = (uint)uVar7;
                    uVar41 = uVar30 & 0xff;
                    uVar29 = uVar41 == 0xff ^ 7;
                    bitstream->cnt_ = uVar29;
                    bitstream->buf_ = (ulong)(uVar47 << (sbyte)uVar29 | uVar41 << 8);
                    uVar47 = pjVar16->flags_;
                    if ((uVar47 & 7) != 0) goto LAB_0012b42f;
                    if ((-1 < pjVar16->rwlimit_) && (pjVar16->rwlimit_ <= pjVar16->rwcnt_))
                    goto LAB_0012b424;
                    *(byte *)&pjVar16->bufmode_ = (byte)pjVar16->bufmode_ | 0x20;
                    iVar15 = pjVar16->cnt_;
                    pjVar16->cnt_ = iVar15 + -1;
                    if (iVar15 < 1) {
                      iVar15 = jas_stream_flushbuf(pjVar16,uVar30 & 0xff);
                      if (iVar15 == -1) goto LAB_0012b42f;
                    }
                    else {
                      pjVar16->rwcnt_ = pjVar16->rwcnt_ + 1;
                      puVar8 = pjVar16->ptr_;
                      pjVar16->ptr_ = puVar8 + 1;
                      *puVar8 = (uchar)uVar7;
                    }
                  }
                  else {
                    bitstream->buf_ = bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar15 & 0x1f))
                    ;
                  }
                  puVar25 = (ulong *)((long)local_e0 + lVar49);
                  if ((uVar36 & uVar33) == 0) {
                    uVar24 = *puVar25;
                  }
                  else {
                    uVar24 = *(ulong *)((long)local_d0 + lVar49);
                    uVar36 = -uVar24;
                    if (0 < (long)uVar24) {
                      uVar36 = uVar24;
                    }
                    local_118->nmsedec =
                         local_118->nmsedec + local_128[(uint)(uVar36 >> (bVar27 & 0x3f)) & 0x7f];
                    if ((bitstream->openmode_ & 2) == 0) {
                      pcVar43 = "(out)->openmode_ & JPC_BITSTREAM_WRITE";
                      goto LAB_0012b7ee;
                    }
                    uVar6 = *(undefined8 *)((long)local_d0 + lVar49);
                    iVar4 = bitstream->cnt_;
                    iVar15 = iVar4 + -1;
                    bitstream->cnt_ = iVar15;
                    uVar47 = (uint)((ulong)uVar6 >> 0x3f);
                    if (iVar4 < 1) {
                      uVar7 = bitstream->buf_;
                      pjVar16 = bitstream->stream_;
                      uVar41 = (uint)uVar7 & 0xff;
                      uVar30 = uVar41 == 0xff ^ 7;
                      bitstream->cnt_ = uVar30;
                      uVar41 = uVar47 << (sbyte)uVar30 | uVar41 << 8;
                      bitstream->buf_ = (ulong)uVar41;
                      uVar47 = pjVar16->flags_;
                      if ((uVar47 & 7) != 0) goto LAB_0012b42f;
                      if ((-1 < pjVar16->rwlimit_) && (pjVar16->rwlimit_ <= pjVar16->rwcnt_))
                      goto LAB_0012b424;
                      *(byte *)&pjVar16->bufmode_ = (byte)pjVar16->bufmode_ | 0x20;
                      iVar15 = pjVar16->cnt_;
                      pjVar16->cnt_ = iVar15 + -1;
                      if (iVar15 < 1) {
                        iVar15 = jas_stream_flushbuf(pjVar16,uVar41 >> 8);
                        if (iVar15 == -1) goto LAB_0012b42f;
                      }
                      else {
                        pjVar16->rwcnt_ = pjVar16->rwcnt_ + 1;
                        puVar8 = pjVar16->ptr_;
                        pjVar16->ptr_ = puVar8 + 1;
                        *puVar8 = (uchar)uVar7;
                      }
                    }
                    else {
                      bitstream->buf_ =
                           bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar15 & 0x1f));
                    }
                    JPC_UPDATEFLAGS4((jpc_fix_t *)puVar25,uVar31,SUB81((ulong)uVar6 >> 0x3f,0),false
                                    );
                    uVar24 = *puVar25 | 0x1000;
                  }
                  *puVar25 = uVar24 | 0x4000;
                }
              }
            }
            lVar49 = lVar49 + 8;
          }
          local_108 = local_108 + iVar28;
          local_100 = local_100 + iVar28;
          local_f8 = local_f8 + iVar28;
          local_e0 = local_e0 + iVar28;
          pjVar34 = pjVar34 + iVar13;
          local_f0 = local_f0 + iVar13;
          local_c8 = local_c8 + iVar13;
          local_d0 = local_d0 + iVar13;
        }
      }
      if (iVar12 != 0) {
        jpc_bitstream_outalign(bitstream,0x2a);
      }
    }
    if (local_118->type == 1) {
      pjVar17 = cblk->mqenc;
      if (local_118->term != 0) {
        jpc_mqenc_init(pjVar17);
        pjVar17 = cblk->mqenc;
      }
      jpc_mqenc_getstate(pjVar17,&local_118->mqencstate);
      lVar49 = jas_stream_tell(cblk->stream);
      local_118->end = (int)lVar49;
      if ((tcmpt->cblksty & 2) != 0) {
        jpc_mqenc_setctxs(cblk->mqenc,0x13,jpc_mqctxs);
      }
    }
    else if (local_118->term == 0) {
      lVar49 = jas_stream_tell(cblk->stream);
      iVar12 = jpc_bitstream_pending(bitstream);
      local_118->end = (int)lVar49 + iVar12;
    }
    else {
      iVar12 = jpc_bitstream_pending(bitstream);
      if (iVar12 != 0) {
        jpc_bitstream_outalign(bitstream,0x2a);
      }
      jpc_bitstream_close(bitstream);
      lVar49 = jas_stream_tell(cblk->stream);
      local_118->end = (int)lVar49;
      bitstream = (jpc_bitstream_t *)0x0;
    }
    dVar51 = (double)band->rlvl->tcmpt->synweight * 0.0001220703125;
    dVar52 = (double)band->synweight * 0.0001220703125;
    dVar53 = (double)band->absstepsize * 0.0001220703125;
    dVar54 = (double)(1 << (bVar27 & 0x1f));
    dVar51 = (double)local_118->nmsedec * 0.0001220703125 *
             dVar51 * dVar51 * dVar52 * dVar52 * dVar53 * dVar53 * dVar54 * dVar54;
    local_118->wmsedec = dVar51;
    local_118->cumwmsedec = dVar51;
    pjVar18 = *ppjVar1;
    if (local_118 != pjVar18) {
      local_118->cumwmsedec = dVar51 + local_118[-1].cumwmsedec;
    }
    iVar11 = iVar11 - (uint)(lVar32 == 2);
    local_118 = local_118 + 1;
  }
  iVar11 = 0;
  if (pjVar18 == (jpc_enc_pass_t *)0x0) {
    pjVar19 = (jpc_enc_pass_t *)0x0;
  }
  else {
    pjVar19 = pjVar18 + cblk->numpasses;
    iVar11 = 0;
  }
  for (; pjVar18 != pjVar19; pjVar18 = pjVar18 + 1) {
    if (pjVar18->start < iVar11) {
      pjVar18->start = iVar11;
    }
    iVar12 = pjVar18->end;
    if (pjVar18->end < iVar11) {
      pjVar18->end = iVar11;
      iVar12 = iVar11;
    }
    if (pjVar18->term == 0) {
      for (lVar49 = 0;
          (lVar49 / 0x48 < (long)(ulong)cblk->numpasses &&
          (*(int *)((long)&pjVar18->term + lVar49) == 0)); lVar49 = lVar49 + 0x48) {
      }
      if (pjVar18->type == 1) {
        bVar50 = (pjVar18->mqencstate).lastbyte == 0xff;
        iVar13 = bVar50 + 5;
        if (4 < (pjVar18->mqencstate).ctreg) {
          iVar13 = bVar50 + 4;
        }
        iVar12 = iVar13 + iVar12;
        pjVar18->end = iVar12;
      }
      iVar13 = *(int *)((long)&pjVar18->end + lVar49);
      if (iVar13 < iVar12) {
        pjVar18->end = iVar13;
        iVar12 = iVar13;
      }
      pjVar16 = cblk->stream;
      lVar49 = jas_stream_tell(pjVar16);
      if (lVar49 < 0) {
        __assert_fail("oldpos >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                      ,0xb5,"int getthebyte(jas_stream_t *, long)");
      }
      jas_stream_seek(pjVar16,(long)(iVar12 + -1),0);
      if (pjVar16->cnt_ < 1) {
        uVar45 = jas_stream_fillbuf(pjVar16,0);
      }
      else {
        uVar45 = (uint)*pjVar16->ptr_;
      }
      jas_stream_seek(pjVar16,lVar49,0);
      if (uVar45 == 0xff) {
        iVar12 = pjVar18->end + 1;
        pjVar18->end = iVar12;
      }
      else {
        if (uVar45 == 0xffffffff) {
          abort();
        }
        iVar12 = pjVar18->end;
      }
    }
    if (iVar11 <= iVar12) {
      iVar11 = iVar12;
    }
  }
  local_70 = 0;
LAB_0012b59e:
  if (bitstream == (jpc_bitstream_t *)0x0) {
    return local_70;
  }
LAB_0012b42f:
  jpc_bitstream_close(bitstream);
  return local_70;
LAB_0012b424:
  pjVar16->flags_ = uVar47 | 4;
  goto LAB_0012b42f;
}

Assistant:

int jpc_enc_enccblk(jpc_enc_tcmpt_t *tcmpt, jpc_enc_band_t *band, jpc_enc_cblk_t *cblk)
{
	jpc_enc_pass_t *pass;
	jpc_enc_pass_t *endpasses;
	int bitpos;
	int n;
	int adjust;
	int ret;
	int passtype;
	int t;
	jpc_bitstream_t *bout;
	jpc_enc_pass_t *termpass;
	int vcausal;
	int segsym;
	int termmode;
	int c;

	bout = 0;

	cblk->stream = jas_stream_memopen(0, 0);
	assert(cblk->stream);
	cblk->mqenc = jpc_mqenc_create(JPC_NUMCTXS, cblk->stream);
	assert(cblk->mqenc);
	jpc_mqenc_setctxs(cblk->mqenc, JPC_NUMCTXS, jpc_mqctxs);

	cblk->numpasses = (cblk->numbps > 0) ? (3 * cblk->numbps - 2) : 0;
	if (cblk->numpasses > 0) {
		cblk->passes = jas_alloc2(cblk->numpasses, sizeof(jpc_enc_pass_t));
		assert(cblk->passes);
	} else {
		cblk->passes = 0;
	}
	endpasses = (cblk->passes) ? &cblk->passes[cblk->numpasses] : 0;
	for (pass = cblk->passes; pass != endpasses; ++pass) {
		pass->start = 0;
		pass->end = 0;
		pass->term = JPC_ISTERMINATED(pass - cblk->passes, 0, cblk->numpasses, (tcmpt->cblksty & JPC_COX_TERMALL) != 0, (tcmpt->cblksty & JPC_COX_LAZY) != 0);
		pass->type = JPC_SEGTYPE(pass - cblk->passes, 0, (tcmpt->cblksty & JPC_COX_LAZY) != 0);
		pass->lyrno = -1;
if (pass == endpasses - 1) {
assert(pass->term == 1);
	pass->term = 1;
}
	}

	cblk->flags = jas_matrix_create(jas_matrix_numrows(cblk->data) + 2,
	  jas_matrix_numcols(cblk->data) + 2);
	assert(cblk->flags);


	bitpos = cblk->numbps - 1;
	pass = cblk->passes;
	n = cblk->numpasses;
	while (--n >= 0) {

		if (pass->type == JPC_SEG_MQ) {
			/* NOP */
		} else {
			assert(pass->type == JPC_SEG_RAW);
			if (!bout) {
				bout = jpc_bitstream_sopen(cblk->stream, "w");
				if (!bout)
					return -1;
			}
		}

#if 1
		passtype = (pass - cblk->passes + 2) % 3;
#else
		passtype = JPC_PASSTYPE(pass - cblk->passes + 2);
#endif
		pass->start = jas_stream_tell(cblk->stream);
#if 0
assert(jas_stream_tell(cblk->stream) == jas_stream_getrwcount(cblk->stream));
#endif
		assert(bitpos >= 0);
		vcausal = (tcmpt->cblksty & JPC_COX_VSC) != 0;
		segsym = (tcmpt->cblksty & JPC_COX_SEGSYM) != 0;
		if (pass->term) {
			termmode = ((tcmpt->cblksty & JPC_COX_PTERM) ?
			  JPC_MQENC_PTERM : JPC_MQENC_DEFTERM) + 1;
		} else {
			termmode = 0;
		}
		switch (passtype) {
		case JPC_SIGPASS:
			ret = (pass->type == JPC_SEG_MQ) ? jpc_encsigpass(cblk->mqenc,
			  bitpos, band->orient, vcausal, cblk->flags,
			  cblk->data, termmode, &pass->nmsedec) :
			  jpc_encrawsigpass(bout, bitpos, vcausal, cblk->flags,
			  cblk->data, termmode, &pass->nmsedec);
			break;
		case JPC_REFPASS:
			ret = (pass->type == JPC_SEG_MQ) ? jpc_encrefpass(cblk->mqenc,
			  bitpos, cblk->flags, cblk->data, termmode,
			  &pass->nmsedec) : jpc_encrawrefpass(bout, bitpos,
			  cblk->flags, cblk->data, termmode,
			  &pass->nmsedec);
			break;
		case JPC_CLNPASS:
			assert(pass->type == JPC_SEG_MQ);
			ret = jpc_encclnpass(cblk->mqenc, bitpos, band->orient,
			  vcausal, segsym, cblk->flags, cblk->data, termmode,
			  &pass->nmsedec);
			break;
		default:
			assert(0);
			break;
		}

		if (ret) {
			if (bout) {
				jpc_bitstream_close(bout);
			}
			return -1;
		}

		if (pass->type == JPC_SEG_MQ) {
			if (pass->term) {
				jpc_mqenc_init(cblk->mqenc);
			}
			jpc_mqenc_getstate(cblk->mqenc, &pass->mqencstate);
			pass->end = jas_stream_tell(cblk->stream);
			if (tcmpt->cblksty & JPC_COX_RESET) {
				jpc_mqenc_setctxs(cblk->mqenc, JPC_NUMCTXS, jpc_mqctxs);
			}
		} else {
			if (pass->term) {
				if (jpc_bitstream_pending(bout)) {
					jpc_bitstream_outalign(bout, 0x2a);
				}
				jpc_bitstream_close(bout);
				bout = 0;
				pass->end = jas_stream_tell(cblk->stream);
			} else {
				pass->end = jas_stream_tell(cblk->stream) +
				  jpc_bitstream_pending(bout);
/* NOTE - This will not work.  need to adjust by # of pending output bytes */
			}
		}
#if 0
/* XXX - This assertion fails sometimes when various coding modes are used.
This seems to be harmless, but why does it happen at all? */
assert(jas_stream_tell(cblk->stream) == jas_stream_getrwcount(cblk->stream));
#endif

		pass->wmsedec = jpc_fixtodbl(band->rlvl->tcmpt->synweight) *
		  jpc_fixtodbl(band->rlvl->tcmpt->synweight) *
		  jpc_fixtodbl(band->synweight) *
		  jpc_fixtodbl(band->synweight) *
		  jpc_fixtodbl(band->absstepsize) * jpc_fixtodbl(band->absstepsize) *
		  ((double) (1 << bitpos)) * ((double)(1 << bitpos)) *
		  jpc_fixtodbl(pass->nmsedec);
		pass->cumwmsedec = pass->wmsedec;
		if (pass != cblk->passes) {
			pass->cumwmsedec += pass[-1].cumwmsedec;
		}
		if (passtype == JPC_CLNPASS) {
			--bitpos;
		}
		++pass;
	}

#if 0
dump_passes(cblk->passes, cblk->numpasses, cblk);
#endif

	n = 0;
	endpasses = (cblk->passes) ? &cblk->passes[cblk->numpasses] : 0;
	for (pass = cblk->passes; pass != endpasses; ++pass) {
		if (pass->start < n) {
			pass->start = n;
		}
		if (pass->end < n) {
			pass->end = n;
		}
		if (!pass->term) {
			termpass = pass;
			while (termpass - pass < cblk->numpasses &&
			  !termpass->term) {
				++termpass;
			}
			if (pass->type == JPC_SEG_MQ) {
				t = (pass->mqencstate.lastbyte == 0xff) ? 1 : 0;
				if (pass->mqencstate.ctreg >= 5) {
					adjust = 4 + t;
				} else {
					adjust = 5 + t;
				}
				pass->end += adjust;
			}
			if (pass->end > termpass->end) {
				pass->end = termpass->end;
			}
			if ((c = getthebyte(cblk->stream, pass->end - 1)) == EOF) {
				abort();
			}
			if (c == 0xff) {
				++pass->end;
			}
			n = JAS_MAX(n, pass->end);
		} else {
			n = JAS_MAX(n, pass->end);
		}
	}

#if 0
dump_passes(cblk->passes, cblk->numpasses, cblk);
#endif

	if (bout) {
		jpc_bitstream_close(bout);
	}

	return 0;
}